

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O3

void __thiscall
CoreML::NeuralNetworkShaper::shapePermuteLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  RepeatedField<unsigned_long> *this_00;
  RangeValue *pRVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  size_t sVar6;
  undefined7 uVar7;
  bool bVar8;
  undefined7 uVar9;
  unsigned_long uVar10;
  LogMessage *pLVar11;
  mapped_type *this_01;
  ShapeRange *pSVar12;
  unsigned_long *puVar13;
  mapped_type *this_02;
  runtime_error *this_03;
  undefined1 *from;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> outranges;
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> ranges;
  PermuteLayerParams permute;
  LogFinisher local_b1;
  undefined1 local_b0 [56];
  vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> local_78;
  unsigned_long local_60;
  PermuteLayerParams local_58;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_58,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
            (&local_78,4,(allocator_type *)local_b0);
  pSVar12 = ShapeConstraint::sequenceRange(this_01);
  bVar8 = (pSVar12->_minimum)._isUnbound;
  uVar9 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar5 = (pSVar12->_minimum)._val;
  uVar7 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar6 = (pSVar12->_maximum)._val;
  ((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_maximum)._isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)
   &((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
      super__Vector_impl_data._M_start)->_maximum).field_0x1 = uVar7;
  ((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_maximum)._val = sVar6;
  ((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_minimum)._isUnbound = bVar8;
  *(undefined7 *)
   &((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
      super__Vector_impl_data._M_start)->_minimum).field_0x1 = uVar9;
  ((local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start)->_minimum)._val = sVar5;
  pSVar12 = ShapeConstraint::channelRange(this_01);
  bVar8 = (pSVar12->_minimum)._isUnbound;
  uVar9 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar5 = (pSVar12->_minimum)._val;
  uVar7 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar6 = (pSVar12->_maximum)._val;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._maximum._isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[1]._maximum.field_0x1 = uVar7;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._maximum._val = sVar6;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._minimum._isUnbound = bVar8;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[1]._minimum.field_0x1 = uVar9;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[1]._minimum._val = sVar5;
  pSVar12 = ShapeConstraint::heightRange(this_01);
  bVar8 = (pSVar12->_minimum)._isUnbound;
  uVar9 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar5 = (pSVar12->_minimum)._val;
  uVar7 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar6 = (pSVar12->_maximum)._val;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._maximum._isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[2]._maximum.field_0x1 = uVar7;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._maximum._val = sVar6;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._minimum._isUnbound = bVar8;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[2]._minimum.field_0x1 = uVar9;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[2]._minimum._val = sVar5;
  pSVar12 = ShapeConstraint::widthRange(this_01);
  bVar8 = (pSVar12->_minimum)._isUnbound;
  uVar9 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
  sVar5 = (pSVar12->_minimum)._val;
  uVar7 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
  sVar6 = (pSVar12->_maximum)._val;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._maximum._isUnbound = (pSVar12->_maximum)._isUnbound;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[3]._maximum.field_0x1 = uVar7;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._maximum._val = sVar6;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._minimum._isUnbound = bVar8;
  *(undefined7 *)
   &local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
    super__Vector_impl_data._M_start[3]._minimum.field_0x1 = uVar9;
  local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl.
  super__Vector_impl_data._M_start[3]._minimum._val = sVar5;
  if (specLayer->_oneof_case_[0] == 0x136) {
    from = *(undefined1 **)&specLayer->layer_;
  }
  else {
    from = Specification::_PermuteLayerParams_default_instance_;
  }
  Specification::PermuteLayerParams::PermuteLayerParams(&local_58,(PermuteLayerParams *)from);
  if (local_58.axis_.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  this_00 = &local_58.axis_;
  puVar13 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  local_60 = *puVar13;
  if (local_58.axis_.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  puVar13 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  uVar2 = puVar13[1];
  if (local_58.axis_.current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  puVar13 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  uVar3 = puVar13[2];
  if (local_58.axis_.current_size_ < 4) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x280);
    pLVar11 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
  }
  puVar13 = google::protobuf::RepeatedField<unsigned_long>::elements(this_00);
  uVar4 = puVar13[3];
  if ((uVar3 | uVar4 | uVar2 | local_60) < 4) {
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
    }
    this_02 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
              ::operator[](&this->blobShapes,
                           (key_type *)
                           ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
    }
    ShapeConstraint::setName
              (this_02,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]
              );
    if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar11 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_b0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_b1,pLVar11);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_b0);
    }
    ShapeConstraint::setName
              (this_02,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]
              );
    uVar10 = local_60;
    ShapeConstraint::updateSequenceRange
              (this_02,local_78.
                       super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                       _M_impl.super__Vector_impl_data._M_start + local_60);
    ShapeConstraint::updateChannelRange
              (this_02,local_78.
                       super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar2);
    ShapeConstraint::updateHeightRange
              (this_02,local_78.
                       super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar3);
    ShapeConstraint::updateWidthRange
              (this_02,local_78.
                       super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar4);
    std::vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>::vector
              ((vector<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_> *)local_b0,4,
               (allocator_type *)&local_b1);
    pSVar12 = ShapeConstraint::sequenceRange(this_02);
    bVar8 = (pSVar12->_minimum)._isUnbound;
    uVar9 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
    sVar5 = (pSVar12->_minimum)._val;
    uVar7 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
    sVar6 = (pSVar12->_maximum)._val;
    pRVar1 = &((ShapeRange *)(local_b0._0_8_ + uVar10 * 0x20))->_maximum;
    pRVar1->_isUnbound = (pSVar12->_maximum)._isUnbound;
    *(undefined7 *)&pRVar1->field_0x1 = uVar7;
    pRVar1->_val = sVar6;
    pSVar12 = (ShapeRange *)(local_b0._0_8_ + uVar10 * 0x20);
    (pSVar12->_minimum)._isUnbound = bVar8;
    *(undefined7 *)&(pSVar12->_minimum).field_0x1 = uVar9;
    (pSVar12->_minimum)._val = sVar5;
    pSVar12 = ShapeConstraint::channelRange(this_02);
    bVar8 = (pSVar12->_minimum)._isUnbound;
    uVar9 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
    sVar5 = (pSVar12->_minimum)._val;
    uVar7 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
    sVar6 = (pSVar12->_maximum)._val;
    pRVar1 = &((ShapeRange *)(local_b0._0_8_ + uVar2 * 0x20))->_maximum;
    pRVar1->_isUnbound = (pSVar12->_maximum)._isUnbound;
    *(undefined7 *)&pRVar1->field_0x1 = uVar7;
    pRVar1->_val = sVar6;
    pSVar12 = (ShapeRange *)(local_b0._0_8_ + uVar2 * 0x20);
    (pSVar12->_minimum)._isUnbound = bVar8;
    *(undefined7 *)&(pSVar12->_minimum).field_0x1 = uVar9;
    (pSVar12->_minimum)._val = sVar5;
    pSVar12 = ShapeConstraint::heightRange(this_02);
    bVar8 = (pSVar12->_minimum)._isUnbound;
    uVar9 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
    sVar5 = (pSVar12->_minimum)._val;
    uVar7 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
    sVar6 = (pSVar12->_maximum)._val;
    pRVar1 = &((ShapeRange *)(local_b0._0_8_ + uVar3 * 0x20))->_maximum;
    pRVar1->_isUnbound = (pSVar12->_maximum)._isUnbound;
    *(undefined7 *)&pRVar1->field_0x1 = uVar7;
    pRVar1->_val = sVar6;
    pSVar12 = (ShapeRange *)(local_b0._0_8_ + uVar3 * 0x20);
    (pSVar12->_minimum)._isUnbound = bVar8;
    *(undefined7 *)&(pSVar12->_minimum).field_0x1 = uVar9;
    (pSVar12->_minimum)._val = sVar5;
    pSVar12 = ShapeConstraint::widthRange(this_02);
    bVar8 = (pSVar12->_minimum)._isUnbound;
    uVar9 = *(undefined7 *)&(pSVar12->_minimum).field_0x1;
    sVar5 = (pSVar12->_minimum)._val;
    uVar7 = *(undefined7 *)&(pSVar12->_maximum).field_0x1;
    sVar6 = (pSVar12->_maximum)._val;
    pRVar1 = &((ShapeRange *)(local_b0._0_8_ + uVar4 * 0x20))->_maximum;
    pRVar1->_isUnbound = (pSVar12->_maximum)._isUnbound;
    *(undefined7 *)&pRVar1->field_0x1 = uVar7;
    pRVar1->_val = sVar6;
    pSVar12 = (ShapeRange *)(local_b0._0_8_ + uVar4 * 0x20);
    (pSVar12->_minimum)._isUnbound = bVar8;
    *(undefined7 *)&(pSVar12->_minimum).field_0x1 = uVar9;
    (pSVar12->_minimum)._val = sVar5;
    ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)local_b0._0_8_);
    ShapeConstraint::updateChannelRange(this_01,(ShapeRange *)(local_b0._0_8_ + 0x20));
    ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)(local_b0._0_8_ + 0x40));
    ShapeConstraint::updateWidthRange(this_01,(ShapeRange *)(local_b0._0_8_ + 0x60));
    pSVar12 = ShapeConstraint::batchRange(this_02);
    ShapeConstraint::updateBatchRange(this_01,pSVar12);
    if ((ShapeRange *)local_b0._0_8_ != (ShapeRange *)0x0) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ - local_b0._0_8_);
    }
    Specification::PermuteLayerParams::~PermuteLayerParams(&local_58);
    if (local_78.super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<CoreML::ShapeRange,_std::allocator<CoreML::ShapeRange>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_03,"Ranges axis index is out of bounds in shapePermuteLayer.");
  __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NeuralNetworkShaper::shapePermuteLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];

    std::vector<ShapeRange> ranges(4);
    ranges[0] = inputShape.sequenceRange();
    ranges[1] = inputShape.channelRange();
    ranges[2] = inputShape.heightRange();
    ranges[3] = inputShape.widthRange();

    Specification::PermuteLayerParams permute = specLayer.permute();
    size_t axis0 = static_cast<size_t>(permute.axis(0));
    size_t axis1 = static_cast<size_t>(permute.axis(1));
    size_t axis2 = static_cast<size_t>(permute.axis(2));
    size_t axis3 = static_cast<size_t>(permute.axis(3));
    
    // Check that indices into "ranges" and "outranges" are not out of bounds.
    if (axis0 > 3 || axis1 > 3 || axis2 > 3 || axis3 > 3) {
        throw std::runtime_error("Ranges axis index is out of bounds in shapePermuteLayer.");
    }

    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Permute layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Permute layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.setName(specLayer.output(0));
    outputShape.updateSequenceRange(ranges[axis0]);
    outputShape.updateChannelRange(ranges[axis1]);
    outputShape.updateHeightRange(ranges[axis2]);
    outputShape.updateWidthRange(ranges[axis3]);

    // Need for the reverse pass as well
    std::vector<ShapeRange> outranges(4);
    outranges[axis0] = outputShape.sequenceRange();
    outranges[axis1] = outputShape.channelRange();
    outranges[axis2] = outputShape.heightRange();
    outranges[axis3] = outputShape.widthRange();

    // Need the constraints to go both ways here
    inputShape.updateSequenceRange(outranges[0]);
    inputShape.updateChannelRange(outranges[1]);
    inputShape.updateHeightRange(outranges[2]);
    inputShape.updateWidthRange(outranges[3]);

    inputShape.updateBatchRange(outputShape.batchRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Permute layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Permute layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif
    
}